

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::IsStringOrMessage(FieldDescriptor *field)

{
  byte bVar1;
  CppType CVar2;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 - CPPTYPE_INT32 < 10) {
    bVar1 = (byte)(0x300 >> ((byte)(CVar2 - CPPTYPE_INT32) & 0x1f));
  }
  else {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x221);
    other = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_41,other);
    internal::LogMessage::~LogMessage(&local_40);
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool IsStringOrMessage(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_FLOAT:
    case FieldDescriptor::CPPTYPE_BOOL:
    case FieldDescriptor::CPPTYPE_ENUM:
      return false;
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return true;
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return false;
}